

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_rand.cc
# Opt level: O2

cpp_gen * new_normal_gen(void)

{
  uint uVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  undefined4 *puVar2;
  cpp_gen *pcVar3;
  random_device rd;
  
  std::random_device::random_device(&rd);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(5000);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this,(ulong)uVar1);
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0x3ff00000;
  *(undefined8 *)(puVar2 + 4) = 0;
  *(undefined1 *)(puVar2 + 6) = 0;
  pcVar3 = (cpp_gen *)operator_new(0x10);
  pcVar3->d = puVar2;
  pcVar3->gen = this;
  std::random_device::~random_device(&rd);
  return pcVar3;
}

Assistant:

struct cpp_gen *new_normal_gen() {
		std::random_device rd {};
		std::mt19937 *gen = new std::mt19937(rd());
		std::normal_distribution<double> *d = new std::normal_distribution<double>();
		struct cpp_gen *ng = new struct cpp_gen;
		ng->d = d;
		ng->gen = gen;

		return ng;
	}